

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O0

err_t MATROSKA_BlockProcessFrameDurations(matroska_block *Block,stream *Input,int ForProfile)

{
  double dVar1;
  bool bVar2;
  ebml_element *peVar3;
  uint uVar4;
  int iVar5;
  ebml_context *peVar6;
  int64_t iVar7;
  err_t eVar8;
  bool_t bVar9;
  ebml_master *Element;
  bool local_3ba;
  bool local_3b9;
  int local_368;
  int local_364;
  codec_setup_info *ci;
  int local_300;
  int j;
  int i;
  int n;
  ogg_buffer OggBuffer;
  ogg_reference OggRef;
  ogg_packet OggPacket;
  vorbis_comment vc;
  vorbis_info vi;
  int fscod2;
  int fscod;
  int Samples;
  int SampleRate;
  int Layer;
  int Version;
  size_t Frame;
  uint8_t *Cursor;
  bool_t ReadData;
  err_t Err;
  tchar_t CodecID [256];
  ebml_element *Elt;
  ebml_master *Track;
  stream *psStack_e0;
  int ForProfile_local;
  stream *Input_local;
  matroska_block *Block_local;
  long local_c8;
  long local_c0;
  undefined8 local_b8;
  long local_b0;
  long local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  long local_90;
  long local_88;
  long local_80;
  undefined8 local_78;
  long local_70;
  long local_68;
  long local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_30;
  long local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  Elt = (ebml_element *)0x0;
  Track._4_4_ = ForProfile;
  psStack_e0 = Input;
  Input_local = (stream *)Block;
  if (Block == (matroska_block *)0x0) {
    __assert_fail("(const void*)(Block)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                  ,0x3b,
                  "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                 );
  }
  ReadData = (**(code **)((long)(Block->Base).Base.Base.Base.VMT + 0x18))(Block,0x180,&Elt,8);
  peVar3 = Elt;
  if (ReadData == 0) {
    if (Elt == (ebml_element *)0x0) {
      __assert_fail("Track!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                    ,0x3e,
                    "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                   );
    }
    peVar6 = MATROSKA_getContextTrackType();
    CodecID._248_8_ = EBML_MasterFindFirstElt((ebml_master *)peVar3,peVar6,0,0,0);
    if (((ebml_integer *)CodecID._248_8_ == (ebml_integer *)0x0) ||
       (iVar7 = EBML_IntegerValue((ebml_integer *)CodecID._248_8_), peVar3 = Elt, iVar7 != 2)) {
      ReadData = -3;
    }
    else if (*(long *)(Input_local->URL + 0x60) == 0) {
      ReadData = -0x15;
    }
    else {
      peVar6 = MATROSKA_getContextCodecID();
      CodecID._248_8_ = EBML_MasterFindFirstElt((ebml_master *)peVar3,peVar6,0,0,0);
      if ((ebml_string *)CodecID._248_8_ == (ebml_string *)0x0) {
        ReadData = -3;
      }
      else {
        EBML_StringGet((ebml_string *)CodecID._248_8_,(tchar_t *)&Err,0x100);
        bVar2 = false;
        if (Input_local == (stream *)0xffffffffffffff58) {
          __assert_fail("&(Block->Data)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                        ,0x4f,
                        "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                       );
        }
        if (*(long *)(Input_local->URL + 0x90) == 0) {
          eVar8 = MATROSKA_BlockReadData((matroska_block *)Input_local,psStack_e0,Track._4_4_);
          if (eVar8 != 0) {
            return eVar8;
          }
          bVar2 = true;
          ReadData = 0;
        }
        bVar9 = tcsisame_ascii((tchar_t *)&Err,"A_MPEG/L3");
        if (((bVar9 == 0) && (bVar9 = tcsisame_ascii((tchar_t *)&Err,"A_MPEG/L2"), bVar9 == 0)) &&
           (bVar9 = tcsisame_ascii((tchar_t *)&Err,"A_MPEG/L1"), bVar9 == 0)) {
          bVar9 = tcsisame_ascii((tchar_t *)&Err,"A_AC3");
          if (bVar9 == 0) {
            bVar9 = tcsisame_ascii((tchar_t *)&Err,"A_EAC3");
            if (bVar9 == 0) {
              bVar9 = tcsisame_ascii((tchar_t *)&Err,"A_DTS");
              if (bVar9 == 0) {
                bVar9 = tcsisame_ascii((tchar_t *)&Err,"A_AAC");
                if ((bVar9 == 0) && (iVar5 = tcsncmp((tchar_t *)&Err,"A_AAC/",6), iVar5 != 0)) {
                  bVar9 = tcsisame_ascii((tchar_t *)&Err,"A_VORBIS");
                  peVar3 = Elt;
                  if (bVar9 != 0) {
                    Input_local->URL[200] = '\x01';
                    Input_local->URL[0xc9] = '\0';
                    Input_local->URL[0xca] = '\0';
                    Input_local->URL[0xcb] = '\0';
                    Input_local->URL[0xcc] = '\0';
                    Input_local->URL[0xcd] = '\0';
                    Input_local->URL[0xce] = '\0';
                    Input_local->URL[0xcf] = '\0';
                    peVar6 = MATROSKA_getContextCodecPrivate();
                    CodecID._248_8_ = EBML_MasterFindFirstElt((ebml_master *)peVar3,peVar6,0,0,0);
                    if ((ebml_element *)CodecID._248_8_ != (ebml_element *)0x0) {
                      vorbis_info_init((vorbis_info *)&vc.vendor);
                      vorbis_comment_init((vorbis_comment *)&OggPacket.packetno);
                      memset(&OggRef.next,0,0x30);
                      _i = EBML_BinaryGetData((ebml_binary *)CodecID._248_8_);
                      OggBuffer.data =
                           (uchar *)EBML_ElementDataSize((ebml_element *)CodecID._248_8_,1);
                      OggBuffer.size._0_4_ = 1;
                      memset(&OggBuffer.ptr,0,0x20);
                      OggBuffer.ptr.owner = (ogg_buffer_state *)&i;
                      OggRef.length = 0;
                      OggRef.next = (ogg_reference *)&OggBuffer.ptr;
                      OggPacket.granulepos = -1;
                      uVar4 = (uint)*_i;
                      local_300 = uVar4 + 1;
                      ci._4_4_ = 1;
                      while (local_3b9 = OggPacket.granulepos < 3 && ci._4_4_ <= (int)uVar4,
                            local_3b9) {
                        OggRef.buffer = (ogg_buffer *)(long)local_300;
                        OggRef.begin = 0;
                        do {
                          OggRef.begin = (ulong)_i[ci._4_4_] + OggRef.begin;
                          iVar5 = ci._4_4_ + 1;
                          local_3ba = _i[ci._4_4_] == 0xff && iVar5 <= (int)uVar4;
                          ci._4_4_ = iVar5;
                        } while (local_3ba);
                        local_300 = local_300 + (int)OggRef.begin;
                        if ((long)OggBuffer.data < (long)local_300) {
                          return (err_t)(matroska_block *)0xfffffffffffffffd;
                        }
                        OggPacket.granulepos = OggPacket.granulepos + 1;
                        OggPacket.bytes = (long)(int)(uint)(OggPacket.granulepos == 0);
                        OggPacket.packet = (ogg_reference *)(OggRef.next)->length;
                        iVar5 = vorbis_synthesis_headerin
                                          ((vorbis_info *)&vc.vendor,
                                           (vorbis_comment *)&OggPacket.packetno,
                                           (ogg_packet *)&OggRef.next);
                        if ((iVar5 < 0) && (OggPacket.granulepos == 0)) {
                          return (err_t)(matroska_block *)0xfffffffffffffffd;
                        }
                      }
                      if (OggPacket.granulepos < 3) {
                        OggRef.buffer = (ogg_buffer *)(long)local_300;
                        OggRef.begin = (long)OggBuffer.data - (long)local_300;
                        OggPacket.granulepos = OggPacket.granulepos + 1;
                        OggPacket.bytes = (long)(int)(uint)(OggPacket.granulepos == 0);
                        OggPacket.packet = (ogg_reference *)(OggRef.next)->length;
                        iVar5 = vorbis_synthesis_headerin
                                          ((vorbis_info *)&vc.vendor,
                                           (vorbis_comment *)&OggPacket.packetno,
                                           (ogg_packet *)&OggRef.next);
                        if ((iVar5 < 0) && (OggPacket.granulepos == 0)) {
                          return (err_t)(matroska_block *)0xfffffffffffffffd;
                        }
                      }
                      if (Input_local == (stream *)0xffffffffffffff78) {
                        __assert_fail("&(Block->SizeList)!=NULL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                      ,0x10a,
                                      "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                     );
                      }
                      ArrayResize((array *)(Input_local->URL + 0x98),
                                  (*(ulong *)(Input_local->URL + 0x70) >> 2) << 3,0);
                      if (Input_local == (stream *)0xffffffffffffff58) {
                        __assert_fail("&(Block->Data)!=NULL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                      ,0x10b,
                                      "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                     );
                      }
                      Frame = *(size_t *)(Input_local->URL + 0x88);
                      _Layer = 0;
                      while( true ) {
                        if (Input_local == (stream *)0xffffffffffffff78) {
                          __assert_fail("&(Block->SizeList)!=NULL",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                        ,0x10d,
                                        "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                       );
                        }
                        if (*(ulong *)(Input_local->URL + 0x70) >> 2 <= _Layer) break;
                        iVar5 = _ilog(*(int *)(vi.bitrate_window + 0x10) - 1);
                        iVar5 = (int)(*(byte *)Frame & 0x7f) >> (7U - (char)iVar5 & 0x1f);
                        if (*(int *)(vi.bitrate_window + 0x10) < iVar5) {
                          ReadData = -3;
                          if (Input_local == (stream *)0xffffffffffffff48) {
                            __assert_fail("&(Block->Durations)!=NULL",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                          ,0x114,
                                          "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                         );
                          }
                          *(undefined8 *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) =
                               0x7fffffffffffffff;
                        }
                        else {
                          local_c0 = (long)(int)*(undefined8 *)
                                                 (vi.bitrate_window +
                                                 (long)**(int **)(vi.bitrate_window + 0x28 +
                                                                 (long)iVar5 * 8) * 8);
                          local_c8 = (long)vi.version;
                          local_b8 = 1000000000;
                          if (local_c8 == 0) {
                            local_b0 = 0;
                          }
                          else {
                            local_b0 = (local_c0 * 1000000000) / local_c8;
                          }
                          if (Input_local == (stream *)0xffffffffffffff48) {
                            __assert_fail("&(Block->Durations)!=NULL",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                          ,0x11a,
                                          "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                         );
                          }
                          *(long *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) = local_b0;
                        }
                        if (Input_local == (stream *)0xffffffffffffff78) {
                          __assert_fail("&(Block->SizeList)!=NULL",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                        ,0x11c,
                                        "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                       );
                        }
                        Frame = Frame + (long)*(int *)(*(long *)(Input_local->URL + 0x68) +
                                                      _Layer * 4);
                        _Layer = _Layer + 1;
                      }
                      vorbis_comment_clear((vorbis_comment *)&OggPacket.packetno);
                      vorbis_info_clear((vorbis_info *)&vc.vendor);
                    }
                  }
                }
                else {
                  peVar3 = Elt;
                  Input_local->URL[200] = '\x01';
                  Input_local->URL[0xc9] = '\0';
                  Input_local->URL[0xca] = '\0';
                  Input_local->URL[0xcb] = '\0';
                  Input_local->URL[0xcc] = '\0';
                  Input_local->URL[0xcd] = '\0';
                  Input_local->URL[0xce] = '\0';
                  Input_local->URL[0xcf] = '\0';
                  peVar6 = MATROSKA_getContextAudio();
                  Element = (ebml_master *)
                            EBML_MasterFindFirstElt((ebml_master *)peVar3,peVar6,0,0,0);
                  CodecID._248_8_ = Element;
                  if (Element != (ebml_master *)0x0) {
                    peVar6 = MATROSKA_getContextSamplingFrequency();
                    CodecID._248_8_ = EBML_MasterFindFirstElt(Element,peVar6,0,0,0);
                    if ((ebml_element *)CodecID._248_8_ != (ebml_element *)0x0) {
                      if (Input_local == (stream *)0xffffffffffffff78) {
                        __assert_fail("&(Block->SizeList)!=NULL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                      ,0xbd,
                                      "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                     );
                      }
                      ArrayResize((array *)(Input_local->URL + 0x98),
                                  (*(ulong *)(Input_local->URL + 0x70) >> 2) << 3,0);
                      dVar1 = *(double *)(CodecID._248_8_ + 0x68);
                      _Layer = 0;
                      while( true ) {
                        if (Input_local == (stream *)0xffffffffffffff78) {
                          __assert_fail("&(Block->SizeList)!=NULL",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                        ,0xc0,
                                        "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                       );
                        }
                        if (*(ulong *)(Input_local->URL + 0x70) >> 2 <= _Layer) break;
                        local_a0 = 0x400;
                        local_a8 = (long)(int)dVar1;
                        local_98 = 1000000000;
                        if (local_a8 == 0) {
                          local_90 = 0;
                        }
                        else {
                          local_90 = 0xee6b280000 / local_a8;
                        }
                        if (Input_local == (stream *)0xffffffffffffff48) {
                          __assert_fail("&(Block->Durations)!=NULL",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                        ,0xc1,
                                        "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                       );
                        }
                        *(long *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) = local_90;
                        _Layer = _Layer + 1;
                      }
                    }
                  }
                }
              }
              else {
                Input_local->URL[200] = '\x01';
                Input_local->URL[0xc9] = '\0';
                Input_local->URL[0xca] = '\0';
                Input_local->URL[0xcb] = '\0';
                Input_local->URL[0xcc] = '\0';
                Input_local->URL[0xcd] = '\0';
                Input_local->URL[0xce] = '\0';
                Input_local->URL[0xcf] = '\0';
                if (Input_local == (stream *)0xffffffffffffff78) {
                  __assert_fail("&(Block->SizeList)!=NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                ,0xa2,
                                "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                               );
                }
                ArrayResize((array *)(Input_local->URL + 0x98),
                            (*(ulong *)(Input_local->URL + 0x70) >> 2) << 3,0);
                if (Input_local == (stream *)0xffffffffffffff58) {
                  __assert_fail("&(Block->Data)!=NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                ,0xa3,
                                "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                               );
                }
                Frame = *(size_t *)(Input_local->URL + 0x88);
                _Layer = 0;
                while( true ) {
                  if (Input_local == (stream *)0xffffffffffffff78) {
                    __assert_fail("&(Block->SizeList)!=NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                  ,0xa4,
                                  "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                 );
                  }
                  if (*(ulong *)(Input_local->URL + 0x70) >> 2 <= _Layer) break;
                  iVar5 = (*(byte *)(Frame + 4) & 1) * 0x80 + ((int)(uint)*(byte *)(Frame + 5) >> 2)
                          + 1;
                  if ((iVar5 == 0) ||
                     (A_DTS_freq[(int)((int)(uint)*(byte *)(Frame + 8) >> 2 & 0xf)] == 0)) {
                    ReadData = -3;
                    if (Input_local == (stream *)0xffffffffffffff48) {
                      __assert_fail("&(Block->Durations)!=NULL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                    ,0xac,
                                    "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                   );
                    }
                    *(undefined8 *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) =
                         0x7fffffffffffffff;
                  }
                  else {
                    local_80 = (long)(iVar5 * 0x20);
                    local_88 = (long)A_DTS_freq[(int)((int)(uint)*(byte *)(Frame + 8) >> 2 & 0xf)];
                    local_78 = 1000000000;
                    if (local_88 == 0) {
                      local_70 = 0;
                    }
                    else {
                      local_70 = (local_80 * 1000000000) / local_88;
                    }
                    if (Input_local == (stream *)0xffffffffffffff48) {
                      __assert_fail("&(Block->Durations)!=NULL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                    ,0xb0,
                                    "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                   );
                    }
                    *(long *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) = local_70;
                  }
                  if (Input_local == (stream *)0xffffffffffffff78) {
                    __assert_fail("&(Block->SizeList)!=NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                  ,0xb1,
                                  "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                 );
                  }
                  Frame = Frame + (long)*(int *)(*(long *)(Input_local->URL + 0x68) + _Layer * 4);
                  _Layer = _Layer + 1;
                }
              }
            }
            else {
              Input_local->URL[200] = '\x01';
              Input_local->URL[0xc9] = '\0';
              Input_local->URL[0xca] = '\0';
              Input_local->URL[0xcb] = '\0';
              Input_local->URL[0xcc] = '\0';
              Input_local->URL[0xcd] = '\0';
              Input_local->URL[0xce] = '\0';
              Input_local->URL[0xcf] = '\0';
              if (Input_local == (stream *)0xffffffffffffff78) {
                __assert_fail("&(Block->SizeList)!=NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                              ,0x8a,
                              "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                             );
              }
              ArrayResize((array *)(Input_local->URL + 0x98),
                          (*(ulong *)(Input_local->URL + 0x70) >> 2) << 3,0);
              if (Input_local == (stream *)0xffffffffffffff58) {
                __assert_fail("&(Block->Data)!=NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                              ,0x8b,
                              "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                             );
              }
              Frame = *(size_t *)(Input_local->URL + 0x88);
              _Layer = 0;
              while( true ) {
                if (Input_local == (stream *)0xffffffffffffff78) {
                  __assert_fail("&(Block->SizeList)!=NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                ,0x8c,
                                "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                               );
                }
                if (*(ulong *)(Input_local->URL + 0x70) >> 2 <= _Layer) break;
                iVar5 = (int)(uint)*(byte *)(Frame + 4) >> 6;
                uVar4 = (int)(uint)*(byte *)(Frame + 4) >> 4 & 3;
                if ((iVar5 == 3) && (uVar4 == 3)) {
                  ReadData = -3;
                  if (Input_local == (stream *)0xffffffffffffff48) {
                    __assert_fail("&(Block->Durations)!=NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                  ,0x93,
                                  "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                 );
                  }
                  *(undefined8 *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) =
                       0x7fffffffffffffff;
                }
                else {
                  local_364 = iVar5;
                  if (iVar5 == 3) {
                    local_364 = uVar4 + 3;
                  }
                  if (iVar5 == 3) {
                    local_368 = 0x600;
                  }
                  else {
                    local_368 = A_EAC3_samples[(int)uVar4];
                  }
                  local_60 = (long)local_368;
                  local_68 = (long)A_EAC3_freq[local_364];
                  local_58 = 1000000000;
                  if (local_68 == 0) {
                    local_50 = 0;
                  }
                  else {
                    local_50 = (local_60 * 1000000000) / local_68;
                  }
                  if (Input_local == (stream *)0xffffffffffffff48) {
                    __assert_fail("&(Block->Durations)!=NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                  ,0x9a,
                                  "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                                 );
                  }
                  *(long *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) = local_50;
                }
                if (Input_local == (stream *)0xffffffffffffff78) {
                  __assert_fail("&(Block->SizeList)!=NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                ,0x9c,
                                "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                               );
                }
                Frame = Frame + (long)*(int *)(*(long *)(Input_local->URL + 0x68) + _Layer * 4);
                _Layer = _Layer + 1;
              }
            }
          }
          else {
            Input_local->URL[200] = '\x01';
            Input_local->URL[0xc9] = '\0';
            Input_local->URL[0xca] = '\0';
            Input_local->URL[0xcb] = '\0';
            Input_local->URL[0xcc] = '\0';
            Input_local->URL[0xcd] = '\0';
            Input_local->URL[0xce] = '\0';
            Input_local->URL[0xcf] = '\0';
            if (Input_local == (stream *)0xffffffffffffff78) {
              __assert_fail("&(Block->SizeList)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                            ,0x73,
                            "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                           );
            }
            ArrayResize((array *)(Input_local->URL + 0x98),
                        (*(ulong *)(Input_local->URL + 0x70) >> 2) << 3,0);
            if (Input_local == (stream *)0xffffffffffffff58) {
              __assert_fail("&(Block->Data)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                            ,0x74,
                            "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                           );
            }
            Frame = *(size_t *)(Input_local->URL + 0x88);
            _Layer = 0;
            while( true ) {
              if (Input_local == (stream *)0xffffffffffffff78) {
                __assert_fail("&(Block->SizeList)!=NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                              ,0x75,
                              "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                             );
              }
              if (*(ulong *)(Input_local->URL + 0x70) >> 2 <= _Layer) break;
              uVar4 = (int)(uint)*(byte *)(Frame + 5) >> 3;
              if ((uVar4 < 0xb) && (7 < uVar4)) {
                local_48 = (long)A_AC3_freq[(int)(uVar4 - 8)][(int)(uint)*(byte *)(Frame + 4) >> 6];
                local_38 = 1000000000;
                local_40 = 0x600;
                if (local_48 == 0) {
                  local_30 = 0;
                }
                else {
                  local_30 = 0x165a0bc0000 / local_48;
                }
                if (Input_local == (stream *)0xffffffffffffff48) {
                  __assert_fail("&(Block->Durations)!=NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                ,0x82,
                                "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                               );
                }
                *(long *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) = local_30;
              }
              else {
                ReadData = -3;
                if (Input_local == (stream *)0xffffffffffffff48) {
                  __assert_fail("&(Block->Durations)!=NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                                ,0x7c,
                                "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                               );
                }
                *(undefined8 *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) =
                     0x7fffffffffffffff;
              }
              if (Input_local == (stream *)0xffffffffffffff78) {
                __assert_fail("&(Block->SizeList)!=NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                              ,0x84,
                              "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                             );
              }
              Frame = Frame + (long)*(int *)(*(long *)(Input_local->URL + 0x68) + _Layer * 4);
              _Layer = _Layer + 1;
            }
          }
        }
        else {
          Input_local->URL[200] = '\x01';
          Input_local->URL[0xc9] = '\0';
          Input_local->URL[0xca] = '\0';
          Input_local->URL[0xcb] = '\0';
          Input_local->URL[0xcc] = '\0';
          Input_local->URL[0xcd] = '\0';
          Input_local->URL[0xce] = '\0';
          Input_local->URL[0xcf] = '\0';
          if (Input_local == (stream *)0xffffffffffffff78) {
            __assert_fail("&(Block->SizeList)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                          ,0x5a,
                          "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                         );
          }
          ArrayResize((array *)(Input_local->URL + 0x98),
                      (*(ulong *)(Input_local->URL + 0x70) >> 2) << 3,0);
          if (Input_local == (stream *)0xffffffffffffff58) {
            __assert_fail("&(Block->Data)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                          ,0x5b,
                          "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                         );
          }
          Frame = *(size_t *)(Input_local->URL + 0x88);
          _Layer = 0;
          while( true ) {
            if (Input_local == (stream *)0xffffffffffffff78) {
              __assert_fail("&(Block->SizeList)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                            ,0x5c,
                            "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                           );
            }
            if (*(ulong *)(Input_local->URL + 0x70) >> 2 <= _Layer) break;
            uVar4 = (int)(uint)*(byte *)(Frame + 1) >> 3 & 3;
            if ((A_MPEG_freq[(int)((int)(uint)*(byte *)(Frame + 2) >> 2 & 3)][(int)uVar4] == 0) ||
               (A_MPEG_samples[(int)((int)(uint)*(byte *)(Frame + 1) >> 1 & 3)][(int)uVar4] == 0)) {
              ReadData = -3;
              if (Input_local == (stream *)0xffffffffffffff48) {
                __assert_fail("&(Block->Durations)!=NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                              ,0x69,
                              "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                             );
              }
              *(undefined8 *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) = 0x7fffffffffffffff;
            }
            else {
              local_20 = (long)A_MPEG_samples[(int)((int)(uint)*(byte *)(Frame + 1) >> 1 & 3)]
                               [(int)uVar4];
              local_28 = (long)A_MPEG_freq[(int)((int)(uint)*(byte *)(Frame + 2) >> 2 & 3)]
                               [(int)uVar4];
              local_18 = 1000000000;
              if (local_28 == 0) {
                local_10 = 0;
              }
              else {
                local_10 = (local_20 * 1000000000) / local_28;
              }
              if (Input_local == (stream *)0xffffffffffffff48) {
                __assert_fail("&(Block->Durations)!=NULL",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                              ,0x65,
                              "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                             );
              }
              *(long *)(*(long *)(Input_local->URL + 0x98) + _Layer * 8) = local_10;
            }
            if (Input_local == (stream *)0xffffffffffffff78) {
              __assert_fail("&(Block->SizeList)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                            ,0x6d,
                            "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                           );
            }
            Frame = Frame + (long)*(int *)(*(long *)(Input_local->URL + 0x68) + _Layer * 4);
            _Layer = _Layer + 1;
          }
        }
        if (bVar2) {
          ArrayClear((array *)(Input_local->URL + 0x88));
          Input_local->URL[0x45] = '\0';
        }
      }
    }
  }
  return (err_t)(matroska_block *)ReadData;
}

Assistant:

err_t MATROSKA_BlockProcessFrameDurations(matroska_block *Block, struct stream *Input, int ForProfile)
{
    ebml_master *Track=NULL;
    ebml_element *Elt;
    tchar_t CodecID[MAXPATH];
    err_t Err;
    bool_t ReadData;
    uint8_t *Cursor;
    size_t Frame;
    int Version, Layer, SampleRate, Samples, fscod, fscod2;

    Err = Node_GET(Block,MATROSKA_BLOCK_READ_TRACK,&Track);
    if (Err==ERR_NONE)
    {
        assert(Track!=NULL);
        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextTrackType());
        if (!Elt || EBML_IntegerValue((ebml_integer*)Elt)!=MATROSKA_TRACK_TYPE_AUDIO) // other track types not supported for now
            Err = ERR_INVALID_DATA;
        else
        {
            if (Block->FirstFrameLocation==0)
                Err = ERR_READ;
            else
            {
                Elt = EBML_MasterFindChild(Track,MATROSKA_getContextCodecID());
                if (!Elt) // missing codec ID
                    Err = ERR_INVALID_DATA;
                else
                {
                    EBML_StringGet((ebml_string*)Elt,CodecID,TSIZEOF(CodecID));
                    ReadData = 0;
                    if (!ARRAYCOUNT(Block->Data,uint8_t))
                    {
                        Err = MATROSKA_BlockReadData(Block,Input,ForProfile);
                        if (Err!=ERR_NONE)
                            goto exit;
                        ReadData = 1;
                    }

                    if (tcsisame_ascii(CodecID,T("A_MPEG/L3")) || tcsisame_ascii(CodecID,T("A_MPEG/L2")) || tcsisame_ascii(CodecID,T("A_MPEG/L1")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            Version = (Cursor[1] >> 3) & 3;
                            Layer = (Cursor[1] >> 1) & 3;
                            SampleRate = (Cursor[2] >> 2) & 3;

                            Samples = A_MPEG_samples[Layer][Version];
                            SampleRate = A_MPEG_freq[SampleRate][Version];
                            if (SampleRate!=0 && Samples!=0)
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            else
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }

                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_AC3")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            fscod =  Cursor[5] >> 3;
                            SampleRate = Cursor[4] >> 6;
                            if (fscod > 10 || fscod < 8)
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                            {
                                SampleRate = A_AC3_freq[fscod-8][SampleRate];
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,1536,SampleRate);
                            }
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_EAC3")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            fscod =  Cursor[4] >> 6;
                            fscod2 = (Cursor[4] >> 4) & 0x03;
                            if ((0x03 == fscod) && (0x03 == fscod2))
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                            {
                                SampleRate = A_EAC3_freq[0x03 == fscod ? 3 + fscod2 : fscod];
                                Samples = (0x03 == fscod) ? 1536 : A_EAC3_samples[fscod2];
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            }
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_DTS")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            Samples = (((Cursor[4] & 1) << 7) + (Cursor[5] >> 2) + 1) * 32;
                            // TODO: handle the frame termination
                            SampleRate = A_DTS_freq[(Cursor[8] >> 2) & 0x0F];
                            if (Samples==0 || SampleRate==0)
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_AAC")) || tcsncmp(CodecID,T("A_AAC/"),6)==0)
                    {
                        Block->IsKeyframe = 1; // safety
                        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextAudio());
                        if (Elt)
                        {
                            Elt = EBML_MasterFindChild((ebml_master*)Elt,MATROSKA_getContextSamplingFrequency());
                            if (Elt)
                            {
                                ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                                Samples = 1024;
                                SampleRate = (int)((ebml_float*)Elt)->Value;
                                for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            }
                        }
                    }
#if defined(CONFIG_CODEC_HELPER)
                    else if (tcsisame_ascii(CodecID,T("A_VORBIS")))
                    {
                        Block->IsKeyframe = 1; // safety
                        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextCodecPrivate());
                        if (Elt)
                        {
                            vorbis_info vi;
                            vorbis_comment vc;
                            ogg_packet OggPacket;
                        	ogg_reference OggRef;
                        	ogg_buffer OggBuffer;
                            int n,i,j;
                            codec_setup_info *ci;

		                    vorbis_info_init(&vi);
		                    vorbis_comment_init(&vc);
                            memset(&OggPacket,0,sizeof(ogg_packet));

		                    OggBuffer.data = (uint8_t*)EBML_BinaryGetData((ebml_binary*)Elt);
		                    OggBuffer.size = (long)EBML_ElementDataSize(Elt, 1);
		                    OggBuffer.refcount = 1;

                            memset(&OggRef,0,sizeof(OggRef));
		                    OggRef.buffer = &OggBuffer;
		                    OggRef.next = NULL;

		                    OggPacket.packet = &OggRef;
		                    OggPacket.packetno = -1;

		                    n = OggBuffer.data[0];
		                    i = 1+n;
		                    j = 1;

		                    while (OggPacket.packetno < 3 && n>=j)
		                    {
			                    OggRef.begin = i;
			                    OggRef.length = 0;
			                    do
			                    {
				                    OggRef.length += OggBuffer.data[j];
			                    }
			                    while (OggBuffer.data[j++] == 255 && n>=j);
			                    i += OggRef.length;

			                    if (i > OggBuffer.size)
				                    return ERR_INVALID_DATA;

	                            ++OggPacket.packetno;
	                            OggPacket.b_o_s = OggPacket.packetno == 0;
	                            OggPacket.bytes = OggPacket.packet->length;
			                    if (!(vorbis_synthesis_headerin(&vi,&vc,&OggPacket) >= 0) && OggPacket.packetno==0)
				                    return ERR_INVALID_DATA;
		                    }

		                    if (OggPacket.packetno < 3)
		                    {
			                    OggRef.begin = i;
			                    OggRef.length = OggBuffer.size - i;

	                            ++OggPacket.packetno;
	                            OggPacket.b_o_s = OggPacket.packetno == 0;
	                            OggPacket.bytes = OggPacket.packet->length;

                                if (!(vorbis_synthesis_headerin(&vi,&vc,&OggPacket) >= 0) && OggPacket.packetno==0)
				                    return ERR_INVALID_DATA;
                            }

                            SampleRate = vi.rate;
                            ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                            Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                            ci = vi.codec_setup;
                            for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                            {
                                fscod = _ilog(ci->modes-1);
                                fscod = (Cursor[0] & 0x7F) >> (7-fscod);
                                if (fscod > ci->modes)
                                {
                                    Err = ERR_INVALID_DATA;
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                    //goto exit;
                                }
                                else
                                {
                                    Samples = ci->blocksizes[ci->mode_param[fscod]->blockflag];
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                                }
                                Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                            }
                            vorbis_comment_clear(&vc);
                            vorbis_info_clear(&vi);
                        }
                    }
#endif

                    if (ReadData)
                    {
                        ArrayClear(&Block->Data);
                        Block->Base.Base.bValueIsSet = 0;
                    }
                }
            }
        }
    }
exit:
    return Err;
}